

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_windowing.cc
# Opt level: O3

bool __thiscall
sptk::DataWindowing::Run
          (DataWindowing *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *windowed_data)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  pointer pdVar7;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (windowed_data != (vector<double,_std::allocator<double>_> *)0x0) {
      pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = this->input_length_;
      lVar3 = (long)iVar4;
      bVar5 = false;
      if ((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 == lVar3) {
        pdVar7 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar7 >> 3 !=
            (long)this->output_length_) {
          std::vector<double,_std::allocator<double>_>::resize
                    (windowed_data,(long)this->output_length_);
          pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = this->input_length_;
          pdVar7 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar3 = (long)iVar4;
        }
        if (iVar4 != 0) {
          pdVar1 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = 0;
          do {
            *(double *)((long)pdVar7 + lVar6) =
                 *(double *)((long)pdVar2 + lVar6) * *(double *)((long)pdVar1 + lVar6);
            lVar6 = lVar6 + 8;
          } while (lVar3 * 8 - lVar6 != 0);
        }
        pdVar2 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar5 = true;
        if (pdVar7 + lVar3 != pdVar2) {
          memset(pdVar7 + lVar3,0,
                 ((long)pdVar2 + (-8 - (long)(pdVar7 + lVar3)) & 0xfffffffffffffff8U) + 8);
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DataWindowing::Run(const std::vector<double>& data,
                        std::vector<double>* windowed_data) const {
  // Check inputs.
  if (!is_valid_ || data.size() != static_cast<std::size_t>(input_length_) ||
      NULL == windowed_data) {
    return false;
  }

  // Prepare memories.
  if (windowed_data->size() != static_cast<std::size_t>(output_length_)) {
    windowed_data->resize(output_length_);
  }

  // Apply window.
  std::transform(data.begin(), data.begin() + input_length_, window_.begin(),
                 windowed_data->begin(),
                 [](double x, double w) { return x * w; });

  // Fill zero.
  std::fill(windowed_data->begin() + input_length_, windowed_data->end(), 0.0);

  return true;
}